

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mri_tables.c
# Opt level: O0

MRIStepCoupling
MRIStepCoupling_Create(int nmat,int stages,int q,int p,sunrealtype *W,sunrealtype *G,sunrealtype *c)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  long in_R8;
  long in_R9;
  MRIStepCoupling MRIC;
  MRISTEP_METHOD_TYPE type;
  int k;
  int j;
  int i;
  int iVar1;
  int in_stack_ffffffffffffffcc;
  int iVar2;
  int local_30;
  int local_2c;
  MRIStepCoupling local_8;
  
  if (((in_EDI < 1) || (in_ESI < 1)) || (MRIC == (MRIStepCoupling)0x0)) {
    local_8 = (MRIStepCoupling)0x0;
  }
  else {
    if ((in_R8 == 0) || (in_R9 == 0)) {
      if ((in_R8 == 0) || (in_R9 != 0)) {
        if ((in_R8 != 0) || (in_R9 == 0)) {
          return (MRIStepCoupling)0x0;
        }
        iVar1 = 1;
      }
      else {
        iVar1 = 0;
      }
    }
    else {
      iVar1 = 2;
    }
    local_8 = MRIStepCoupling_Alloc(in_stack_ffffffffffffffcc,iVar1,MRISTEP_EXPLICIT);
    if (local_8 == (MRIStepCoupling)0x0) {
      local_8 = (MRIStepCoupling)0x0;
    }
    else {
      local_8->q = in_EDX;
      local_8->p = in_ECX;
      for (local_2c = 0; local_2c < in_ESI; local_2c = local_2c + 1) {
        local_8->c[local_2c] = *(sunrealtype *)(&MRIC->nmat + (long)local_2c * 2);
      }
      if ((iVar1 == 0) || (iVar1 == 2)) {
        for (iVar2 = 0; iVar2 < in_EDI; iVar2 = iVar2 + 1) {
          for (local_2c = 0; local_2c < in_ESI; local_2c = local_2c + 1) {
            for (local_30 = 0; local_30 < in_ESI; local_30 = local_30 + 1) {
              local_8->W[iVar2][local_2c][local_30] =
                   *(sunrealtype *)
                    (in_R8 + (long)(in_ESI * (in_ESI * iVar2 + local_2c) + local_30) * 8);
            }
          }
        }
      }
      if ((iVar1 == 1) || (iVar1 == 2)) {
        for (iVar1 = 0; iVar1 < in_EDI; iVar1 = iVar1 + 1) {
          for (local_2c = 0; local_2c < in_ESI; local_2c = local_2c + 1) {
            for (local_30 = 0; local_30 < in_ESI; local_30 = local_30 + 1) {
              local_8->G[iVar1][local_2c][local_30] =
                   *(sunrealtype *)
                    (in_R9 + (long)(in_ESI * (in_ESI * iVar1 + local_2c) + local_30) * 8);
            }
          }
        }
      }
    }
  }
  return local_8;
}

Assistant:

MRIStepCoupling MRIStepCoupling_Create(int nmat, int stages, int q, int p,
                                       sunrealtype* W, sunrealtype* G,
                                       sunrealtype* c)
{
  int i, j, k;
  MRISTEP_METHOD_TYPE type;
  MRIStepCoupling MRIC = NULL;

  /* Check for legal inputs */
  if (nmat < 1 || stages < 1 || !c) { return (NULL); }

  /* Check for method coefficients and set method type */
  if (W && G) { type = MRISTEP_IMEX; }
  else if (W && !G) { type = MRISTEP_EXPLICIT; }
  else if (!W && G) { type = MRISTEP_IMPLICIT; }
  else { return (NULL); }

  /* Allocate MRIStepCoupling structure */
  MRIC = MRIStepCoupling_Alloc(nmat, stages, type);
  if (!MRIC) { return (NULL); }

  /* -------------------------
   * Copy the inputs into MRIC
   * ------------------------- */

  /* Method and embedding order */
  MRIC->q = q;
  MRIC->p = p;

  /* Abscissae */
  for (i = 0; i < stages; i++) { MRIC->c[i] = c[i]; }

  /* Coupling coefficients stored as 1D arrays of length nmat * stages * stages,
     with each stages * stages matrix stored in C (row-major) order */
  if (type == MRISTEP_EXPLICIT || type == MRISTEP_IMEX)
  {
    for (k = 0; k < nmat; k++)
    {
      for (i = 0; i < stages; i++)
      {
        for (j = 0; j < stages; j++)
        {
          MRIC->W[k][i][j] = W[stages * (stages * k + i) + j];
        }
      }
    }
  }
  if (type == MRISTEP_IMPLICIT || type == MRISTEP_IMEX)
  {
    for (k = 0; k < nmat; k++)
    {
      for (i = 0; i < stages; i++)
      {
        for (j = 0; j < stages; j++)
        {
          MRIC->G[k][i][j] = G[stages * (stages * k + i) + j];
        }
      }
    }
  }

  return (MRIC);
}